

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O0

bool __thiscall
spirv_cross::Compiler::type_is_top_level_physical_pointer(Compiler *this,SPIRType *type)

{
  uint uVar1;
  uint32_t id;
  SPIRType *pSVar2;
  bool local_19;
  SPIRType *type_local;
  Compiler *this_local;
  
  local_19 = false;
  if (((type->pointer & 1U) != 0) &&
     (local_19 = false, type->storage == StorageClassPhysicalStorageBuffer)) {
    uVar1 = type->pointer_depth;
    id = TypedID::operator_cast_to_unsigned_int((TypedID *)&type->parent_type);
    pSVar2 = get<spirv_cross::SPIRType>(this,id);
    local_19 = pSVar2->pointer_depth < uVar1;
  }
  return local_19;
}

Assistant:

bool Compiler::type_is_top_level_physical_pointer(const SPIRType &type) const
{
	return type.pointer && type.storage == StorageClassPhysicalStorageBuffer &&
	       type.pointer_depth > get<SPIRType>(type.parent_type).pointer_depth;
}